

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  ExtensionSet *this_00;
  bool bVar1;
  CppType CVar2;
  string *psVar3;
  LogMessage *pLVar4;
  LogFinisher local_11a;
  byte local_119;
  LogMessage local_118;
  LogFinisher local_da;
  byte local_d9;
  LogMessage local_d8;
  LogFinisher local_9d [20];
  byte local_89;
  LogMessage local_88;
  Extension *local_50;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_38;
  int number_local;
  ExtensionSet *this_local;
  string *local_28;
  string *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  ExtensionSet *local_10;
  
  extension = (Extension *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_38 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_50);
  if (bVar1) {
    local_50->type = descriptor_local._3_1_;
    CVar2 = anon_unknown_29::cpp_type(local_50->type);
    local_89 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_88,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,500);
      local_89 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_88,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(local_9d,pLVar4);
    }
    if ((local_89 & 1) != 0) {
      LogMessage::~LogMessage(&local_88);
    }
    local_50->is_repeated = false;
    this_00 = (ExtensionSet *)this->arena_;
    this_local = this_00;
    if (this_00 == (ExtensionSet *)0x0) {
      psVar3 = (string *)operator_new(0x20);
      std::__cxx11::string::string((string *)psVar3);
      local_28 = psVar3;
    }
    else {
      t._7_1_ = 0;
      local_10 = this_00;
      psVar3 = (string *)
               Arena::AllocateAligned
                         ((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
      std::__cxx11::string::string((string *)psVar3);
      local_20 = psVar3;
      if ((t._7_1_ & 1) == 0) {
        Arena::AddListNode((Arena *)this_00,psVar3,arena_destruct_object<std::__cxx11::string>);
      }
      local_28 = local_20;
    }
    (local_50->field_0).string_value = local_28;
  }
  else {
    local_d9 = 0;
    if ((local_50->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1f8);
      local_d9 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_da,pLVar4);
    }
    if ((local_d9 & 1) != 0) {
      LogMessage::~LogMessage(&local_d8);
    }
    CVar2 = anon_unknown_29::cpp_type(local_50->type);
    local_119 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_118,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1f8);
      local_119 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_118,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_11a,pLVar4);
    }
    if ((local_119 & 1) != 0) {
      LogMessage::~LogMessage(&local_118);
    }
  }
  local_50->field_0xa = local_50->field_0xa & 0xf0;
  return (string *)(local_50->field_0).int64_value;
}

Assistant:

string* ExtensionSet::MutableString(int number, FieldType type,
                                    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = Arena::Create<string>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}